

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

void dictionary_text_close(dictionary_t t_dictionary)

{
  long *local_28;
  ucs4_t **j;
  size_t i;
  text_dictionary_desc *text_dictionary;
  dictionary_t t_dictionary_local;
  
  for (j = (ucs4_t **)0x0; j < *t_dictionary; j = (ucs4_t **)((long)j + 1)) {
    free(*(void **)(*(long *)((long)t_dictionary + 0x10) + (long)j * 0x10));
    for (local_28 = *(long **)(*(long *)((long)t_dictionary + 0x10) + (long)j * 0x10 + 8);
        *local_28 != 0; local_28 = local_28 + 1) {
      free((void *)*local_28);
    }
    free(*(void **)(*(long *)((long)t_dictionary + 0x10) + (long)j * 0x10 + 8));
  }
  free(*(void **)((long)t_dictionary + 0x10));
  free(*(void **)((long)t_dictionary + 0x18));
  free(t_dictionary);
  return;
}

Assistant:

void dictionary_text_close(dictionary_t t_dictionary)
{
	text_dictionary_desc * text_dictionary = (text_dictionary_desc *) t_dictionary;

	size_t i;
	for (i = 0; i < text_dictionary->entry_count; ++ i)
	{
		free(text_dictionary->lexicon[i].key);

		ucs4_t ** j;
		for (j = text_dictionary->lexicon[i].value; *j; ++ j)
		{
			free(*j);
		}
		free(text_dictionary->lexicon[i].value);
	}

	free(text_dictionary->lexicon);
	free(text_dictionary->word_buff);
	free(text_dictionary);
}